

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O2

void signalfd_in_thread_test(int which)

{
  int iVar1;
  uint32_t __fd;
  pthread_t __threadid;
  ssize_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  int ep;
  epoll_event event_result;
  pthread_t thread;
  epoll_event event;
  signalfd_siginfo fdsi;
  sigset_t mask;
  
  sigemptyset((sigset_t *)&mask);
  sigaddset((sigset_t *)&mask,2);
  iVar1 = sigprocmask(0,(sigset_t *)&mask,(sigset_t *)0x0);
  if (iVar1 == 0) {
    __fd = signalfd(-1,(sigset_t *)&mask,0);
    if ((int)__fd < 0) {
      pcVar3 = "sfd >= 0";
      uVar4 = 0x3c8;
    }
    else {
      ep = epoll_create1(0x80000);
      if (ep < 0) {
        pcVar3 = "ep >= 0";
        uVar4 = 0x3cb;
      }
      else {
        event.events = 1;
        event.data.fd = __fd;
        iVar1 = epoll_ctl(ep,1,__fd,(epoll_event *)&event);
        if (iVar1 == 0) {
          iVar1 = epoll_wait(ep,(epoll_event *)&event_result,1,0);
          if (iVar1 == 0) {
            __threadid = pthread_self();
            iVar1 = pthread_kill(__threadid,2);
            if (iVar1 == 0) {
              fdsi.ssi_signo = ep;
              fdsi.ssi_errno = 1;
              iVar1 = poll((pollfd *)&fdsi,1,-1);
              if (iVar1 == 1) {
                if (fdsi.ssi_errno._2_2_ == 1) {
                  iVar1 = pthread_create(&thread,(pthread_attr_t *)0x0,signalfd_thread,&ep);
                  if (iVar1 == 0) {
                    iVar1 = pthread_join(thread,(void **)0x0);
                    if (iVar1 == 0) {
                      if (which == 0) {
                        fdsi.ssi_signo = ep;
                        fdsi.ssi_errno = 1;
                        iVar1 = poll((pollfd *)&fdsi,1,0);
                        if (iVar1 != 0) {
                          pcVar3 = "poll(&pfd, 1, 0) == 0";
                          uVar4 = 0x3ed;
                          goto LAB_0010677d;
                        }
                        iVar1 = epoll_wait(ep,(epoll_event *)&event_result,1,0);
                        if (iVar1 != 0) {
                          pcVar3 = "epoll_wait(ep, &event_result, 1, 0) == 0";
                          uVar4 = 0x3ef;
                          goto LAB_0010677d;
                        }
                        iVar1 = epoll_ctl(ep,2,__fd,(epoll_event *)0x0);
                        if (iVar1 != 0) {
                          pcVar3 = "epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0";
                          uVar4 = 0x3f1;
                          goto LAB_0010677d;
                        }
                        iVar1 = epoll_ctl(ep,1,__fd,(epoll_event *)&event);
                        if (iVar1 != 0) {
                          pcVar3 = "epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0";
                          uVar4 = 0x3f2;
                          goto LAB_0010677d;
                        }
                        iVar1 = epoll_wait(ep,(epoll_event *)&event_result,1,-1);
                        if (iVar1 != 1) {
                          pcVar3 = "epoll_wait(ep, &event_result, 1, -1) == 1";
                          uVar4 = 0x3f4;
                          goto LAB_0010677d;
                        }
                        if (event_result.events != 1) {
                          pcVar3 = "event_result.events == EPOLLIN";
                          uVar4 = 0x3f5;
                          goto LAB_0010677d;
                        }
                        if (event_result.data.fd != __fd) {
                          pcVar3 = "event_result.data.fd == sfd";
                          uVar4 = 0x3f6;
                          goto LAB_0010677d;
                        }
                      }
                      else {
                        fdsi.ssi_errno = 1;
                        fdsi.ssi_signo = __fd;
                        iVar1 = poll((pollfd *)&fdsi,1,-1);
                        if (iVar1 != 1) {
                          pcVar3 = "poll(&pfd, 1, -1) == 1";
                          uVar4 = 0x3e9;
                          goto LAB_0010677d;
                        }
                        if (fdsi.ssi_errno._2_2_ != 1) {
                          pcVar3 = "pfd.revents == POLLIN";
                          uVar4 = 0x3ea;
                          goto LAB_0010677d;
                        }
                      }
                      sVar2 = read(__fd,&fdsi,0x80);
                      if (sVar2 == 0x80) {
                        iVar1 = sigprocmask(1,(sigset_t *)&mask,(sigset_t *)0x0);
                        if (iVar1 == 0) {
                          iVar1 = close(ep);
                          if (iVar1 == 0) {
                            iVar1 = close(__fd);
                            if (iVar1 == 0) {
                              return;
                            }
                            pcVar3 = "close(sfd) == 0";
                            uVar4 = 0x3ff;
                          }
                          else {
                            pcVar3 = "close(ep) == 0";
                            uVar4 = 0x3fe;
                          }
                        }
                        else {
                          pcVar3 = "sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0";
                          uVar4 = 0x3fc;
                        }
                      }
                      else {
                        pcVar3 = "s == sizeof(struct signalfd_siginfo)";
                        uVar4 = 0x3fa;
                      }
                    }
                    else {
                      pcVar3 = "pthread_join(thread, NULL) == 0";
                      uVar4 = 0x3e5;
                    }
                  }
                  else {
                    pcVar3 = "pthread_create(&thread, NULL, signalfd_thread, &ep) == 0";
                    uVar4 = 0x3e4;
                  }
                }
                else {
                  pcVar3 = "pfd.revents == POLLIN";
                  uVar4 = 0x3e0;
                }
              }
              else {
                pcVar3 = "poll(&pfd, 1, -1) == 1";
                uVar4 = 0x3df;
              }
            }
            else {
              pcVar3 = "pthread_kill(pthread_self(), SIGINT) == 0";
              uVar4 = 0x3d6;
            }
          }
          else {
            pcVar3 = "epoll_wait(ep, &event_result, 1, 0) == 0";
            uVar4 = 0x3d4;
          }
        }
        else {
          pcVar3 = "epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0";
          uVar4 = 0x3d1;
        }
      }
    }
  }
  else {
    pcVar3 = "sigprocmask(SIG_BLOCK, &mask, NULL) == 0";
    uVar4 = 0x3c5;
  }
LAB_0010677d:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar4,pcVar3);
}

Assistant:

static void
signalfd_in_thread_test(int which)
{
	sigset_t mask;
	struct signalfd_siginfo fdsi;
	ssize_t s;

	sigemptyset(&mask);
	sigaddset(&mask, SIGINT);

	ATF_REQUIRE(sigprocmask(SIG_BLOCK, &mask, NULL) == 0);

	int sfd = signalfd(-1, &mask, 0);
	ATF_REQUIRE(sfd >= 0);

	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = sfd;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

	ATF_REQUIRE(pthread_kill(pthread_self(), SIGINT) == 0);

	{
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
#if defined(__DragonFly__) || defined(__APPLE__)
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);
		atf_tc_skip("signals sent to threads won't trigger "
			    "EVFILT_SIGNAL on DragonFly/macOS");
#endif
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	}

	pthread_t thread;
	ATF_REQUIRE(pthread_create(&thread, NULL, signalfd_thread, &ep) == 0);
	ATF_REQUIRE(pthread_join(thread, NULL) == 0);

	if (which) {
		struct pollfd pfd = { .fd = sfd, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	} else {
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0);
		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);
		ATF_REQUIRE(event_result.events == EPOLLIN);
		ATF_REQUIRE(event_result.data.fd == sfd);
	}

	s = read(sfd, &fdsi, sizeof(struct signalfd_siginfo));
	ATF_REQUIRE(s == sizeof(struct signalfd_siginfo));

	ATF_REQUIRE(sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0);

	ATF_REQUIRE(close(ep) == 0);
	ATF_REQUIRE(close(sfd) == 0);
}